

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerBreakpointManager.cxx
# Opt level: O3

SetBreakpointsResponse * __thiscall
cmDebugger::cmDebuggerBreakpointManager::HandleSetBreakpointsRequest
          (SetBreakpointsResponse *__return_storage_ptr__,cmDebuggerBreakpointManager *this,
          SetBreakpointsRequest *request)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>_>
  *this_00;
  bool bVar1;
  pointer pcVar2;
  pointer pBVar3;
  SetBreakpointsRequest *pSVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  iterator iVar7;
  pointer pSVar8;
  vector<cmDebugger::cmDebuggerSourceBreakpoint,std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>>
  *pvVar9;
  long lVar10;
  long lVar11;
  SetBreakpointsRequest *pSVar12;
  ulong uVar13;
  string sourcePath;
  Source dapSrc;
  int64_t correctedLine;
  unique_lock<std::mutex> lock;
  string local_1d8;
  vector<dap::any,_std::allocator<dap::any>_> local_1b8;
  undefined1 local_198 [176];
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  bool local_c8;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  bool local_a0;
  integer local_98;
  bool local_90;
  undefined1 local_88 [24];
  bool bStack_70;
  long local_68;
  int64_t local_60;
  unique_lock<std::mutex> local_58;
  pointer local_48;
  pointer pSStack_40;
  pointer local_38;
  
  local_58._M_device = &this->Mutex;
  local_58._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_58);
  local_58._M_owns = true;
  (__return_storage_ptr__->breakpoints).
  super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->breakpoints).
  super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->breakpoints).
  super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((request->source).path.set == false) {
    __assert_fail("set",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/optional.h"
                  ,0x75,
                  "const T &dap::optional<std::basic_string<char>>::value() const [T = std::basic_string<char>]"
                 );
  }
  cmsys::SystemTools::GetActualCaseForPath(&local_1d8,&(request->source).path.val);
  local_48 = (pointer)0x0;
  pSStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  bVar1 = (request->breakpoints).set;
  pSVar4 = (SetBreakpointsRequest *)&stack0xffffffffffffffb8;
  if (bVar1 != false) {
    pSVar4 = request;
  }
  this_00 = &this->Breakpoints;
  iVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,&local_1d8);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    pmVar6 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,&local_1d8);
    pcVar2 = (pmVar6->
             super__Vector_base<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((pmVar6->
        super__Vector_base<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
        )._M_impl.super__Vector_impl_data._M_finish != pcVar2) {
      (pmVar6->
      super__Vector_base<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
      )._M_impl.super__Vector_impl_data._M_finish = pcVar2;
    }
  }
  pSVar12 = (SetBreakpointsRequest *)&stack0xffffffffffffffb8;
  if (bVar1 != false) {
    pSVar12 = request;
  }
  std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>::resize
            (&__return_storage_ptr__->breakpoints,
             ((long)(pSVar12->breakpoints).val.
                    super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pSVar4->breakpoints).val.
                    super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7);
  iVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->ListFileFunctionLines)._M_h,&local_1d8);
  if (iVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_M_emplace<std::__cxx11::string&>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&this->ListFilePendingValidations,&local_1d8);
    if ((pSVar12->breakpoints).val.
        super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pSVar4->breakpoints).val.
        super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar11 = 0x60;
      lVar10 = 0;
      uVar13 = 0;
      do {
        pvVar9 = (vector<cmDebugger::cmDebuggerSourceBreakpoint,std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>>
                  *)std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_00,&local_1d8);
        local_198._0_8_ = this->NextBreakpointId;
        this->NextBreakpointId = local_198._0_8_ + 1;
        local_68 = lVar11;
        std::
        vector<cmDebugger::cmDebuggerSourceBreakpoint,std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>>
        ::emplace_back<long,dap::integer_const&>
                  (pvVar9,(long *)local_198,
                   (integer *)
                   ((long)&((pSVar4->breakpoints).val.
                            super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>
                            ._M_impl.super__Vector_impl_data._M_start)->column + lVar11));
        pmVar6 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_00,&local_1d8);
        pBVar3 = (__return_storage_ptr__->breakpoints).
                 super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(int64_t *)((long)&(pBVar3->source).val + lVar10 + 0xffffffffffffff80U) =
             (pmVar6->
             super__Vector_base<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
             )._M_impl.super__Vector_impl_data._M_finish[-1].Id;
        *(undefined1 *)((long)&(pBVar3->source).val + lVar10 + 0xffffffffffffff88U) = 1;
        pmVar6 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_00,&local_1d8);
        pBVar3 = (__return_storage_ptr__->breakpoints).
                 super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(int64_t *)((long)&(pBVar3->source).val + lVar10 + 0xffffffffffffffb8U) =
             (pmVar6->
             super__Vector_base<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
             )._M_impl.super__Vector_impl_data._M_finish[-1].Line;
        *(undefined1 *)((long)&(pBVar3->source).val + lVar10 + 0xffffffffffffffc0U) = 1;
        (&pBVar3->verified)[lVar10].val = false;
        local_1b8.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1b8.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1b8.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_198._0_8_ = (void *)0x0;
        local_198._8_8_ = (TypeInfo *)0x0;
        local_198._16_8_ = (void *)0x0;
        dap::any::operator=((any *)local_198,&local_1b8);
        std::vector<dap::any,_std::allocator<dap::any>_>::~vector(&local_1b8);
        local_198[0x38] = false;
        local_198[0x50] = 0;
        local_198._81_8_ = 0;
        local_198._64_8_ = (pointer)0x0;
        local_198[0x48] = 0;
        local_198._73_7_ = 0;
        local_198._96_8_ = local_198 + 0x70;
        local_198._104_8_ = 0;
        local_198[0x70] = '\0';
        local_198[0x80] = false;
        local_198._136_8_ = local_198 + 0x98;
        local_198._144_8_ = 0;
        local_198[0x98] = '\0';
        local_198[0xa8] = false;
        local_e8._M_p = (pointer)&local_d8;
        local_e0 = 0;
        local_d8._M_local_buf[0] = '\0';
        local_c8 = false;
        local_c0._M_p = (pointer)&local_b0;
        local_b8 = 0;
        local_b0._M_local_buf[0] = '\0';
        local_a0 = false;
        local_98.val = 0;
        local_90 = false;
        local_88[0x10] = 0;
        stack0xffffffffffffff89 = 0;
        local_88._0_8_ = (pointer)0x0;
        local_88[8] = 0;
        local_88._9_7_ = 0;
        std::__cxx11::string::_M_assign((string *)&local_e8);
        local_c8 = true;
        pBVar3 = (__return_storage_ptr__->breakpoints).
                 super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dap::any::operator=((any *)((long)&(pBVar3->source).val + lVar10),(any *)local_198);
        *(bool *)((long)&(pBVar3->source).val + lVar10 + 0x38U) = local_198[0x38];
        std::vector<dap::Checksum,_std::allocator<dap::Checksum>_>::operator=
                  ((vector<dap::Checksum,_std::allocator<dap::Checksum>_> *)
                   ((long)&(pBVar3->source).val + lVar10 + 0x40U),
                   (vector<dap::Checksum,_std::allocator<dap::Checksum>_> *)(local_198 + 0x40));
        *(bool *)((long)&(pBVar3->source).val + lVar10 + 0x58U) = local_198[0x58];
        std::__cxx11::string::_M_assign((string *)((long)&(pBVar3->source).val + lVar10 + 0x60U));
        *(bool *)((long)&(pBVar3->source).val + lVar10 + 0x80U) = local_198[0x80];
        std::__cxx11::string::_M_assign((string *)((long)&(pBVar3->source).val + lVar10 + 0x88U));
        *(bool *)((long)&(pBVar3->source).val + lVar10 + 0xa8U) = local_198[0xa8];
        std::__cxx11::string::_M_assign((string *)((long)&(pBVar3->source).val + lVar10 + 0xb0U));
        *(bool *)((long)&(pBVar3->source).val + lVar10 + 0xd0U) = local_c8;
        std::__cxx11::string::_M_assign((string *)((long)&(pBVar3->source).val + lVar10 + 0xd8U));
        *(bool *)((long)&(pBVar3->source).val + lVar10 + 0xf8U) = local_a0;
        *(int64_t *)((long)&(pBVar3->source).val + lVar10 + 0x100U) = local_98.val;
        *(bool *)((long)&(pBVar3->source).val + lVar10 + 0x108U) = local_90;
        std::vector<dap::Source,_std::allocator<dap::Source>_>::operator=
                  ((vector<dap::Source,_std::allocator<dap::Source>_> *)
                   ((long)&(pBVar3->source).val + lVar10 + 0x110U),
                   (vector<dap::Source,_std::allocator<dap::Source>_> *)local_88);
        *(bool *)((long)&(pBVar3->source).val + lVar10 + 0x128U) = bStack_70;
        *(undefined1 *)((long)&(pBVar3->source).set + lVar10) = 1;
        dap::Source::~Source((Source *)local_198);
        uVar13 = uVar13 + 1;
        lVar10 = lVar10 + 0x1f0;
        lVar11 = local_68 + 0x90;
      } while (uVar13 < (ulong)(((long)(pSVar12->breakpoints).val.
                                       super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pSVar4->breakpoints).val.
                                       super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4) *
                               -0x71c71c71c71c71c7));
    }
  }
  else {
    pSVar8 = (pSVar4->breakpoints).val.
             super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pSVar12->breakpoints).val.
        super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>._M_impl.
        super__Vector_impl_data._M_finish != pSVar8) {
      lVar11 = 0x60;
      lVar10 = 0;
      uVar13 = 0;
      do {
        local_60 = CalibrateBreakpointLine
                             (this,&local_1d8,*(int64_t *)((long)&(pSVar8->column).val.val + lVar11)
                             );
        if (local_60 < 1) {
          pBVar3 = (__return_storage_ptr__->breakpoints).
                   super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
                   super__Vector_impl_data._M_start;
          (&pBVar3->verified)[lVar10].val = false;
          *(undefined8 *)((long)&(pBVar3->source).val + lVar10 + 0xffffffffffffffb8U) =
               *(undefined8 *)
                ((long)&((pSVar4->breakpoints).val.
                         super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>
                         ._M_impl.super__Vector_impl_data._M_start)->column + lVar11);
          *(undefined1 *)((long)&(pBVar3->source).val + lVar10 + 0xffffffffffffffc0U) = 1;
        }
        else {
          pvVar9 = (vector<cmDebugger::cmDebuggerSourceBreakpoint,std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>>
                    *)std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this_00,&local_1d8);
          local_198._0_8_ = this->NextBreakpointId;
          this->NextBreakpointId = local_198._0_8_ + 1;
          std::
          vector<cmDebugger::cmDebuggerSourceBreakpoint,std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>>
          ::emplace_back<long,long&>(pvVar9,(long *)local_198,&local_60);
          pmVar6 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this_00,&local_1d8);
          pBVar3 = (__return_storage_ptr__->breakpoints).
                   super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(int64_t *)((long)&(pBVar3->source).val + lVar10 + 0xffffffffffffff80U) =
               (pmVar6->
               super__Vector_base<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
               )._M_impl.super__Vector_impl_data._M_finish[-1].Id;
          *(undefined1 *)((long)&(pBVar3->source).val + lVar10 + 0xffffffffffffff88U) = 1;
          pmVar6 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this_00,&local_1d8);
          pBVar3 = (__return_storage_ptr__->breakpoints).
                   super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(int64_t *)((long)&(pBVar3->source).val + lVar10 + 0xffffffffffffffb8U) =
               (pmVar6->
               super__Vector_base<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
               )._M_impl.super__Vector_impl_data._M_finish[-1].Line;
          *(undefined1 *)((long)&(pBVar3->source).val + lVar10 + 0xffffffffffffffc0U) = 1;
          (&pBVar3->verified)[lVar10].val = true;
        }
        local_1b8.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1b8.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1b8.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_198._0_8_ = (void *)0x0;
        local_198._8_8_ = (TypeInfo *)0x0;
        local_198._16_8_ = (void *)0x0;
        dap::any::operator=((any *)local_198,&local_1b8);
        std::vector<dap::any,_std::allocator<dap::any>_>::~vector(&local_1b8);
        local_198[0x38] = false;
        local_198[0x50] = 0;
        local_198._81_8_ = 0;
        local_198._64_8_ = (pointer)0x0;
        local_198[0x48] = 0;
        local_198._73_7_ = 0;
        local_198._96_8_ = local_198 + 0x70;
        local_198._104_8_ = 0;
        local_198[0x70] = '\0';
        local_198[0x80] = false;
        local_198._136_8_ = local_198 + 0x98;
        local_198._144_8_ = 0;
        local_198[0x98] = '\0';
        local_198[0xa8] = false;
        local_e8._M_p = (pointer)&local_d8;
        local_e0 = 0;
        local_d8._M_local_buf[0] = '\0';
        local_c8 = false;
        local_c0._M_p = (pointer)&local_b0;
        local_b8 = 0;
        local_b0._M_local_buf[0] = '\0';
        local_a0 = false;
        local_98.val = 0;
        local_90 = false;
        local_88[0x10] = 0;
        stack0xffffffffffffff89 = 0;
        local_88._0_8_ = (pointer)0x0;
        local_88[8] = 0;
        local_88._9_7_ = 0;
        std::__cxx11::string::_M_assign((string *)&local_e8);
        local_c8 = true;
        pBVar3 = (__return_storage_ptr__->breakpoints).
                 super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dap::any::operator=((any *)((long)&(pBVar3->source).val + lVar10),(any *)local_198);
        *(bool *)((long)&(pBVar3->source).val + lVar10 + 0x38U) = local_198[0x38];
        std::vector<dap::Checksum,_std::allocator<dap::Checksum>_>::operator=
                  ((vector<dap::Checksum,_std::allocator<dap::Checksum>_> *)
                   ((long)&(pBVar3->source).val + lVar10 + 0x40U),
                   (vector<dap::Checksum,_std::allocator<dap::Checksum>_> *)(local_198 + 0x40));
        *(bool *)((long)&(pBVar3->source).val + lVar10 + 0x58U) = local_198[0x58];
        std::__cxx11::string::_M_assign((string *)((long)&(pBVar3->source).val + lVar10 + 0x60U));
        *(bool *)((long)&(pBVar3->source).val + lVar10 + 0x80U) = local_198[0x80];
        std::__cxx11::string::_M_assign((string *)((long)&(pBVar3->source).val + lVar10 + 0x88U));
        *(bool *)((long)&(pBVar3->source).val + lVar10 + 0xa8U) = local_198[0xa8];
        std::__cxx11::string::_M_assign((string *)((long)&(pBVar3->source).val + lVar10 + 0xb0U));
        *(bool *)((long)&(pBVar3->source).val + lVar10 + 0xd0U) = local_c8;
        std::__cxx11::string::_M_assign((string *)((long)&(pBVar3->source).val + lVar10 + 0xd8U));
        *(bool *)((long)&(pBVar3->source).val + lVar10 + 0xf8U) = local_a0;
        *(int64_t *)((long)&(pBVar3->source).val + lVar10 + 0x100U) = local_98.val;
        *(bool *)((long)&(pBVar3->source).val + lVar10 + 0x108U) = local_90;
        std::vector<dap::Source,_std::allocator<dap::Source>_>::operator=
                  ((vector<dap::Source,_std::allocator<dap::Source>_> *)
                   ((long)&(pBVar3->source).val + lVar10 + 0x110U),
                   (vector<dap::Source,_std::allocator<dap::Source>_> *)local_88);
        *(bool *)((long)&(pBVar3->source).val + lVar10 + 0x128U) = bStack_70;
        *(undefined1 *)((long)&(pBVar3->source).set + lVar10) = 1;
        dap::Source::~Source((Source *)local_198);
        uVar13 = uVar13 + 1;
        pSVar8 = (pSVar4->breakpoints).val.
                 super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 0x1f0;
        lVar11 = lVar11 + 0x90;
      } while (uVar13 < (ulong)(((long)(pSVar12->breakpoints).val.
                                       super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >>
                                4) * -0x71c71c71c71c71c7));
    }
  }
  std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>::~vector
            ((vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> *)
             &stack0xffffffffffffffb8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_58);
  return __return_storage_ptr__;
}

Assistant:

dap::SetBreakpointsResponse
cmDebuggerBreakpointManager::HandleSetBreakpointsRequest(
  dap::SetBreakpointsRequest const& request)
{
  std::unique_lock<std::mutex> lock(Mutex);

  dap::SetBreakpointsResponse response;

  auto sourcePath =
    cmSystemTools::GetActualCaseForPath(request.source.path.value());
  const dap::array<dap::SourceBreakpoint> defaultValue{};
  const auto& breakpoints = request.breakpoints.value(defaultValue);

  if (Breakpoints.find(sourcePath) != Breakpoints.end()) {
    Breakpoints[sourcePath].clear();
  }
  response.breakpoints.resize(breakpoints.size());

  if (ListFileFunctionLines.find(sourcePath) != ListFileFunctionLines.end()) {
    // The file has loaded, we can validate breakpoints.
    for (size_t i = 0; i < breakpoints.size(); i++) {
      int64_t correctedLine =
        CalibrateBreakpointLine(sourcePath, breakpoints[i].line);
      if (correctedLine > 0) {
        Breakpoints[sourcePath].emplace_back(NextBreakpointId++,
                                             correctedLine);
        response.breakpoints[i].id = Breakpoints[sourcePath].back().GetId();
        response.breakpoints[i].line =
          Breakpoints[sourcePath].back().GetLine();
        response.breakpoints[i].verified = true;
      } else {
        response.breakpoints[i].verified = false;
        response.breakpoints[i].line = breakpoints[i].line;
      }
      dap::Source dapSrc;
      dapSrc.path = sourcePath;
      response.breakpoints[i].source = dapSrc;
    }
  } else {
    // The file has not loaded, validate breakpoints later.
    ListFilePendingValidations.emplace(sourcePath);

    for (size_t i = 0; i < breakpoints.size(); i++) {
      Breakpoints[sourcePath].emplace_back(NextBreakpointId++,
                                           breakpoints[i].line);
      response.breakpoints[i].id = Breakpoints[sourcePath].back().GetId();
      response.breakpoints[i].line = Breakpoints[sourcePath].back().GetLine();
      response.breakpoints[i].verified = false;
      dap::Source dapSrc;
      dapSrc.path = sourcePath;
      response.breakpoints[i].source = dapSrc;
    }
  }

  return response;
}